

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt_FindGlyphIndex(stbtt_fontinfo *info,int unicode_codepoint)

{
  uchar *puVar1;
  long lVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  
  puVar1 = info->data;
  uVar4 = info->index_map;
  uVar5 = (ulong)uVar4;
  uVar3 = *(ushort *)(puVar1 + uVar5) << 8;
  uVar11 = *(ushort *)(puVar1 + uVar5) >> 8;
  uVar6 = uVar3 | uVar11;
  switch(uVar6) {
  case 0:
    if (unicode_codepoint <
        (int)((ushort)(*(ushort *)(puVar1 + uVar5 + 2) << 8 | *(ushort *)(puVar1 + uVar5 + 2) >> 8)
             - 6)) {
      return (uint)puVar1[(long)unicode_codepoint + uVar5 + 6];
    }
    break;
  default:
    if ((uVar3 | uVar11 & 0xfffe) != 0xc) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                    ,0x5fe,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
    }
    uVar4 = *(uint *)(puVar1 + uVar5 + 0xc);
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    if (0 < (int)uVar4) {
      iVar9 = 0;
      do {
        uVar8 = ((int)(uVar4 - iVar9) >> 1) + iVar9;
        lVar2 = (long)(int)uVar8 * 0xc;
        uVar12 = *(uint *)(puVar1 + lVar2 + uVar5 + 0x10);
        uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18
        ;
        if (uVar12 <= (uint)unicode_codepoint) {
          uVar7 = *(uint *)(puVar1 + lVar2 + uVar5 + 0x14);
          if ((uint)unicode_codepoint <=
              (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18)) {
            uVar4 = *(uint *)(puVar1 + lVar2 + uVar5 + 0x18);
            iVar9 = 0;
            if (uVar6 == 0xc) {
              iVar9 = unicode_codepoint - uVar12;
            }
            return iVar9 + (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                           uVar4 << 0x18);
          }
          iVar9 = uVar8 + 1;
          uVar8 = uVar4;
        }
        uVar4 = uVar8;
      } while (iVar9 < (int)uVar4);
    }
    break;
  case 2:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                  ,0x5b7,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
  case 4:
    if (unicode_codepoint < 0x10000) {
      uVar3 = *(ushort *)(puVar1 + uVar5 + 10) << 8 | *(ushort *)(puVar1 + uVar5 + 10) >> 8;
      uVar10 = (ulong)(puVar1[uVar5 + 0xd] & 0xfffffffe) | (ulong)puVar1[uVar5 + 0xc] << 8;
      iVar9 = (int)uVar10;
      if (unicode_codepoint <
          (int)(uint)(ushort)(*(ushort *)(puVar1 + uVar10 + (uVar4 + 0xe)) << 8 |
                             *(ushort *)(puVar1 + uVar10 + (uVar4 + 0xe)) >> 8)) {
        iVar9 = 0;
      }
      uVar12 = iVar9 + uVar4 + 0xc;
      if (uVar3 != 0) {
        uVar8 = (uint)(ushort)(*(ushort *)(puVar1 + uVar5 + 8) << 8 |
                              *(ushort *)(puVar1 + uVar5 + 8) >> 8);
        do {
          uVar8 = uVar8 >> 1;
          uVar7 = uVar8 & 0xfffffffe;
          if (unicode_codepoint <=
              (int)(uint)(ushort)(*(ushort *)(puVar1 + (ulong)uVar7 + (ulong)uVar12) << 8 |
                                 *(ushort *)(puVar1 + (ulong)uVar7 + (ulong)uVar12) >> 8)) {
            uVar7 = 0;
          }
          uVar12 = uVar7 + uVar12;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      uVar10 = (ulong)((uVar12 - uVar4) + 0x1fff4 & 0x1fffe);
      if (unicode_codepoint <=
          (int)(uint)(ushort)(*(ushort *)(puVar1 + uVar10 + (uVar4 + 0xe)) << 8 |
                             *(ushort *)(puVar1 + uVar10 + (uVar4 + 0xe)) >> 8)) {
        uVar3 = *(ushort *)(puVar1 + uVar5 + 6) << 8 | *(ushort *)(puVar1 + uVar5 + 6) >> 8;
        uVar4 = 0;
        uVar12 = (uint)(ushort)(*(ushort *)(puVar1 + uVar10 + (uVar3 & 0xfffffffe) + uVar5 + 0x10)
                                << 8 | *(ushort *)
                                        (puVar1 + uVar10 + (uVar3 & 0xfffffffe) + uVar5 + 0x10) >> 8
                               );
        if ((int)uVar12 <= unicode_codepoint) {
          uVar3 = uVar3 >> 1;
          lVar2 = (ulong)((uint)uVar3 + (uint)uVar3) * 3;
          uVar11 = *(ushort *)(puVar1 + uVar10 + 2 + lVar2 + uVar5 + 0xe) << 8 |
                   *(ushort *)(puVar1 + uVar10 + 2 + lVar2 + uVar5 + 0xe) >> 8;
          if (uVar11 == 0) {
            uVar4 = (uint)(ushort)(*(ushort *)(puVar1 + uVar10 + 2 + (ulong)uVar3 * 4 + uVar5 + 0xe)
                                   << 8 | *(ushort *)
                                           (puVar1 + uVar10 + 2 + (ulong)uVar3 * 4 + uVar5 + 0xe) >>
                                          8) + unicode_codepoint;
          }
          else {
            uVar4 = (uint)(ushort)(*(ushort *)
                                    (puVar1 + uVar10 + 0x10 +
                                              (long)(int)((unicode_codepoint - uVar12) * 2) +
                                              lVar2 + uVar5 + uVar11) << 8 |
                                  *(ushort *)
                                   (puVar1 + uVar10 + 0x10 +
                                             (long)(int)((unicode_codepoint - uVar12) * 2) +
                                             lVar2 + uVar5 + uVar11) >> 8);
          }
        }
        return uVar4 & 0xffff;
      }
      __assert_fail("unicode_codepoint <= ttUSHORT(data + endCount + 2*item)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                    ,0x5db,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
    }
    break;
  case 6:
    uVar3 = *(ushort *)(puVar1 + uVar5 + 6) << 8 | *(ushort *)(puVar1 + uVar5 + 6) >> 8;
    if ((uint)unicode_codepoint < (uint)uVar3) {
      return 0;
    }
    if ((uint)(ushort)(*(ushort *)(puVar1 + uVar5 + 8) << 8 | *(ushort *)(puVar1 + uVar5 + 8) >> 8)
        + (uint)uVar3 <= (uint)unicode_codepoint) {
      return 0;
    }
    return (uint)(ushort)(*(ushort *)
                           (puVar1 + (ulong)((unicode_codepoint - (uint)uVar3) * 2) + uVar5 + 10) <<
                          8 | *(ushort *)
                               (puVar1 + (ulong)((unicode_codepoint - (uint)uVar3) * 2) + uVar5 + 10
                               ) >> 8);
  }
  return 0;
}

Assistant:

STBTT_DEF int stbtt_FindGlyphIndex(const stbtt_fontinfo *info, int unicode_codepoint)
{
   stbtt_uint8 *data = info->data;
   stbtt_uint32 index_map = info->index_map;

   stbtt_uint16 format = ttUSHORT(data + index_map + 0);
   if (format == 0) { // apple byte encoding
      stbtt_int32 bytes = ttUSHORT(data + index_map + 2);
      if (unicode_codepoint < bytes-6)
         return ttBYTE(data + index_map + 6 + unicode_codepoint);
      return 0;
   } else if (format == 6) {
      stbtt_uint32 first = ttUSHORT(data + index_map + 6);
      stbtt_uint32 count = ttUSHORT(data + index_map + 8);
      if ((stbtt_uint32) unicode_codepoint >= first && (stbtt_uint32) unicode_codepoint < first+count)
         return ttUSHORT(data + index_map + 10 + (unicode_codepoint - first)*2);
      return 0;
   } else if (format == 2) {
      STBTT_assert(0); // @TODO: high-byte mapping for japanese/chinese/korean
      return 0;
   } else if (format == 4) { // standard mapping for windows fonts: binary search collection of ranges
      stbtt_uint16 segcount = ttUSHORT(data+index_map+6) >> 1;
      stbtt_uint16 searchRange = ttUSHORT(data+index_map+8) >> 1;
      stbtt_uint16 entrySelector = ttUSHORT(data+index_map+10);
      stbtt_uint16 rangeShift = ttUSHORT(data+index_map+12) >> 1;

      // do a binary search of the segments
      stbtt_uint32 endCount = index_map + 14;
      stbtt_uint32 search = endCount;

      if (unicode_codepoint > 0xffff)
         return 0;

      // they lie from endCount .. endCount + segCount
      // but searchRange is the nearest power of two, so...
      if (unicode_codepoint >= ttUSHORT(data + search + rangeShift*2))
         search += rangeShift*2;

      // now decrement to bias correctly to find smallest
      search -= 2;
      while (entrySelector) {
         stbtt_uint16 end;
         searchRange >>= 1;
         end = ttUSHORT(data + search + searchRange*2);
         if (unicode_codepoint > end)
            search += searchRange*2;
         --entrySelector;
      }
      search += 2;

      {
         stbtt_uint16 offset, start;
         stbtt_uint16 item = (stbtt_uint16) ((search - endCount) >> 1);

         STBTT_assert(unicode_codepoint <= ttUSHORT(data + endCount + 2*item));
         start = ttUSHORT(data + index_map + 14 + segcount*2 + 2 + 2*item);
         if (unicode_codepoint < start)
            return 0;

         offset = ttUSHORT(data + index_map + 14 + segcount*6 + 2 + 2*item);
         if (offset == 0)
            return (stbtt_uint16) (unicode_codepoint + ttSHORT(data + index_map + 14 + segcount*4 + 2 + 2*item));

         return ttUSHORT(data + offset + (unicode_codepoint-start)*2 + index_map + 14 + segcount*6 + 2 + 2*item);
      }
   } else if (format == 12 || format == 13) {
      stbtt_uint32 ngroups = ttULONG(data+index_map+12);
      stbtt_int32 low,high;
      low = 0; high = (stbtt_int32)ngroups;
      // Binary search the right group.
      while (low < high) {
         stbtt_int32 mid = low + ((high-low) >> 1); // rounds down, so low <= mid < high
         stbtt_uint32 start_char = ttULONG(data+index_map+16+mid*12);
         stbtt_uint32 end_char = ttULONG(data+index_map+16+mid*12+4);
         if ((stbtt_uint32) unicode_codepoint < start_char)
            high = mid;
         else if ((stbtt_uint32) unicode_codepoint > end_char)
            low = mid+1;
         else {
            stbtt_uint32 start_glyph = ttULONG(data+index_map+16+mid*12+8);
            if (format == 12)
               return start_glyph + unicode_codepoint-start_char;
            else // format == 13
               return start_glyph;
         }
      }
      return 0; // not found
   }
   // @TODO
   STBTT_assert(0);
   return 0;
}